

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProgramOptions.cpp
# Opt level: O3

vector<Config::Size,_std::allocator<Config::Size>_> *
ProgramOptions::parseTextureSize
          (vector<Config::Size,_std::allocator<Config::Size>_> *__return_storage_ptr__,string *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  char *pcVar3;
  iterator __position;
  bool bVar4;
  int iVar5;
  int *piVar6;
  ulong uVar7;
  undefined8 *puVar8;
  string *s_00;
  Size size;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ss;
  Size local_a0;
  string local_98;
  vector<Config::Size,std::allocator<Config::Size>> *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  (__return_storage_ptr__->super__Vector_base<Config::Size,_std::allocator<Config::Size>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Config::Size,_std::allocator<Config::Size>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Config::Size,_std::allocator<Config::Size>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  local_70 = (vector<Config::Size,std::allocator<Config::Size>> *)__return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,",","");
  string_split(&local_48,s,&local_98,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  local_50 = (string *)
             local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  s_00 = (string *)
         local_48.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_98._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"x","");
      string_split(&local_68,s_00,&local_98,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if ((long)local_68.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_68.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0x40) {
LAB_001b5421:
        puVar8 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar8 = std::__cxx11::string::operator=;
        __cxa_throw(puVar8,&std::exception::typeinfo,std::exception::~exception);
      }
      if ((parseTextureSize(std::__cxx11::string_const&)::e_abi_cxx11_ == '\0') &&
         (iVar5 = __cxa_guard_acquire(&parseTextureSize(std::__cxx11::string_const&)::e_abi_cxx11_),
         iVar5 != 0)) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  (&parseTextureSize(std::__cxx11::string_const&)::e_abi_cxx11_,"^[1-9]\\d{0,9}$",
                   0x10);
        __cxa_atexit(Catch::clara::std::__cxx11::
                     basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                     &parseTextureSize(std::__cxx11::string_const&)::e_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&parseTextureSize(std::__cxx11::string_const&)::e_abi_cxx11_);
      }
      _Var2._M_current =
           ((local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      local_98.field_2._M_allocated_capacity = 0;
      local_98.field_2._8_8_ = 0;
      local_98._M_dataplus._M_p = (pointer)0x0;
      local_98._M_string_length = 0;
      bVar4 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                        (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )(_Var2._M_current +
                                 (local_68.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_string_length),
                         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)&local_98,
                         (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                         &parseTextureSize(std::__cxx11::string_const&)::e_abi_cxx11_,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if (!bVar4) goto LAB_001b5421;
      _Var2._M_current =
           local_68.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
      local_98.field_2._M_allocated_capacity = 0;
      local_98.field_2._8_8_ = 0;
      local_98._M_dataplus._M_p = (pointer)0x0;
      local_98._M_string_length = 0;
      bVar4 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                        (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )(_Var2._M_current +
                                 local_68.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length),
                         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)&local_98,
                         (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                         &parseTextureSize(std::__cxx11::string_const&)::e_abi_cxx11_,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if (!bVar4) goto LAB_001b5421;
      local_a0.w = 0;
      local_a0.h = 0;
      pcVar3 = ((local_68.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      piVar6 = __errno_location();
      iVar5 = *piVar6;
      *piVar6 = 0;
      uVar7 = strtoul(pcVar3,(char **)&local_98,10);
      if (local_98._M_dataplus._M_p == pcVar3) {
        std::__throw_invalid_argument("stoul");
LAB_001b545b:
        std::__throw_invalid_argument("stoul");
LAB_001b5467:
        puVar8 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar8 = std::__cxx11::string::operator=;
        __cxa_throw(puVar8,&std::exception::typeinfo,std::exception::~exception);
      }
      if (*piVar6 != 0) {
        if (*piVar6 != 0x22) goto LAB_001b52e2;
        std::__throw_out_of_range("stoul");
LAB_001b54a6:
        std::__throw_out_of_range("stoul");
        goto LAB_001b54b2;
      }
      *piVar6 = iVar5;
LAB_001b52e2:
      local_a0.w = (uint32_t)uVar7;
      pcVar3 = local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
      iVar5 = *piVar6;
      *piVar6 = 0;
      uVar7 = strtoul(pcVar3,(char **)&local_98,10);
      __return_storage_ptr__ = (vector<Config::Size,_std::allocator<Config::Size>_> *)local_70;
      if (local_98._M_dataplus._M_p == pcVar3) goto LAB_001b545b;
      if (*piVar6 == 0) {
        *piVar6 = iVar5;
      }
      else if (*piVar6 == 0x22) goto LAB_001b54a6;
      local_a0.h = (uint)uVar7;
      if ((0x10000 < (uint)uVar7) || (0x10000 < local_a0.w)) goto LAB_001b5467;
      __position._M_current = *(Size **)(local_70 + 8);
      if (__position._M_current == *(Size **)(local_70 + 0x10)) {
        std::vector<Config::Size,std::allocator<Config::Size>>::_M_realloc_insert<Config::Size&>
                  (local_70,__position,&local_a0);
      }
      else {
        *__position._M_current = local_a0;
        *(long *)(local_70 + 8) = *(long *)(local_70 + 8) + 8;
      }
      Catch::clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_68);
      s_00 = s_00 + 1;
    } while (s_00 != local_50);
  }
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_48);
  if (*(pointer *)__return_storage_ptr__ != *(pointer *)((long)__return_storage_ptr__ + 8)) {
    return (vector<Config::Size,_std::allocator<Config::Size>_> *)
           (vector<Config::Size,std::allocator<Config::Size>> *)__return_storage_ptr__;
  }
LAB_001b54b2:
  puVar8 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar8 = std::__cxx11::string::operator=;
  __cxa_throw(puVar8,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

std::vector<Config::Size> ProgramOptions::parseTextureSize(const std::string& s)
{
    std::vector<Config::Size> result;

    try
    {
        for (const auto& p: string_split(s, ",", false))
        {
            auto ss = string_split(p, "x", false);
            if (ss.size() != 2)
                throw std::exception();

            static const std::regex e(R"(^[1-9]\d{0,9}$)");     // only integers > 0, no more than 10 digits (enough for 4294967295 - max uint32_t)
            if (!std::regex_match(ss[0], e))
                throw std::exception();
            if (!std::regex_match(ss[1], e))
                throw std::exception();

            Config::Size size;
            size.w = std::stoul(ss[0]);
            size.h = std::stoul(ss[1]);
            if (size.w  > 65536 || size.h > 65536)
                throw std::exception();
            result.emplace_back(size);
        }

        if (result.empty())
            throw std::exception();
    }
    catch (const std::exception&)
    {
        throw std::runtime_error("invalid texture size argument");
    }

    return result;
}